

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O3

void kmp_set_defaults_(char *str,int len)

{
  if (__kmp_init_serial == 0) {
    __kmp_serial_initialize();
  }
  __kmp_env_initialize(str);
  if (((__kmp_settings == 0) && (__kmp_display_env == 0)) && (__kmp_display_env_verbose == 0)) {
    return;
  }
  __kmp_env_print();
  return;
}

Assistant:

void FTN_STDCALL FTN_SET_DEFAULTS(char const *str
#ifndef PASS_ARGS_BY_VALUE
                                  ,
                                  int len
#endif
                                  ) {
#ifndef KMP_STUB
#ifdef PASS_ARGS_BY_VALUE
  int len = (int)KMP_STRLEN(str);
#endif
  __kmp_aux_set_defaults(str, len);
#endif
}